

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform.h
# Opt level: O3

bool __thiscall
senjo::NumberParam<int>(senjo *this,string *name,int *value,char **params,bool *invalid)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  
  if ((((name == (string *)0x0) || (pcVar6 = *params, pcVar6 == (char *)0x0)) ||
      (iVar2 = strncmp(pcVar6,(char *)this,(size_t)name), iVar2 != 0)) ||
     ((pcVar6[(long)name] != '\0' && (iVar2 = isspace((int)pcVar6[(long)name]), iVar2 == 0)))) {
    bVar3 = false;
  }
  else {
    *params = pcVar6 + (long)&name->_M_dataplus;
    cVar1 = pcVar6[(long)&name->_M_dataplus];
    if (cVar1 != '\0') {
      pcVar6 = pcVar6 + (long)&name->_M_dataplus;
      do {
        pcVar5 = pcVar6 + 1;
        iVar2 = isspace((int)cVar1);
        if (iVar2 == 0) {
          if ((int)cVar1 - 0x30U < 10) {
            *params = pcVar5;
            iVar2 = *pcVar6 + -0x30;
            *value = iVar2;
            cVar1 = *pcVar5;
            iVar4 = (int)cVar1;
            if (iVar4 - 0x30U < 10) {
              pcVar6 = pcVar6 + 2;
              do {
                pcVar5 = pcVar6;
                *params = pcVar5;
                iVar2 = (int)pcVar5[-1] + iVar2 * 10 + -0x30;
                *value = iVar2;
                cVar1 = *pcVar5;
                iVar4 = (int)cVar1;
                pcVar6 = pcVar5 + 1;
              } while (iVar4 - 0x30U < 10);
            }
            if (cVar1 == '\0') {
              return true;
            }
            iVar2 = isspace(iVar4);
            if (iVar2 != 0) {
              do {
                pcVar5 = pcVar5 + 1;
                iVar2 = isspace((int)cVar1);
                if (iVar2 == 0) {
                  return true;
                }
                *params = pcVar5;
                cVar1 = *pcVar5;
              } while (cVar1 != '\0');
              return true;
            }
          }
          break;
        }
        *params = pcVar5;
        cVar1 = *pcVar5;
        pcVar6 = pcVar5;
      } while (cVar1 != '\0');
    }
    *invalid = true;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

static inline bool NumberParam(const std::string& name, Number& value,
                               const char*& params, bool& invalid)
{
  if (!ParamMatch(name, params)) {
    return false;
  }
  if (!params || !*params || !isdigit(*params)) {
    invalid = true;
  }
  else {
    value = (*params++ - '0');
    while (*params && isdigit(*params)) {
      value = ((10 * value) + (*params++ - '0'));
    }
    if (*params && !isspace(*params)) {
      invalid = true;
    }
    else {
      NextWord(params);
    }
  }
  return true;
}